

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O2

void __thiscall CountAggregate::createAggregateRegister(CountAggregate *this)

{
  DTree *this_00;
  int *piVar1;
  int *piVar2;
  int **ppiVar3;
  bool *pbVar4;
  DTreeNode *pDVar5;
  long lVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  
  std::
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ::resize(&this->_aggregateRegister,_NUM_OF_ATTRIBUTES);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::resize(&this->_lineageRegister,_NUM_OF_ATTRIBUTES);
  uVar9 = _NUM_OF_ATTRIBUTES;
  uVar8 = 0;
  uVar7 = -(ulong)((_NUM_OF_ATTRIBUTES & 0x3000000000000000) != 0) | _NUM_OF_ATTRIBUTES << 4;
  piVar2 = (int *)operator_new__(uVar7);
  memset(piVar2,0,uVar7);
  this->_numberOfAggregatesPerNode = piVar2;
  uVar7 = -(ulong)(uVar9 >> 0x3e != 0) | uVar9 * 4;
  piVar2 = (int *)operator_new__(uVar7);
  memset(piVar2,0,uVar7);
  this->_degreeOfLocalAggregates = piVar2;
  uVar7 = -(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8;
  ppiVar3 = (int **)operator_new__(uVar7);
  this->aggPlaceholder = ppiVar3;
  ppiVar3 = (int **)operator_new__(uVar7);
  this->lineagePlaceholder = ppiVar3;
  pbVar4 = (bool *)operator_new__(uVar9);
  memset(pbVar4,0,uVar9);
  this->onehotfeatures = pbVar4;
  pbVar4 = (bool *)operator_new__(uVar9);
  memset(pbVar4,0,uVar9);
  this->isDetermined = pbVar4;
  uVar7 = -(ulong)(uVar9 + 1 >> 0x3e != 0) | uVar9 * 4 + 4;
  piVar2 = (int *)operator_new__(uVar7);
  memset(piVar2,0,uVar7);
  this->determinedBy = piVar2;
  uVar7 = -(ulong)(dfdb::params::NUM_OF_FEATURES >> 0x3d != 0) | dfdb::params::NUM_OF_FEATURES << 3;
  ppiVar3 = (int **)operator_new__(uVar7);
  memset(ppiVar3,0,uVar7);
  this->_features = ppiVar3;
  while( true ) {
    this_00 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pDVar5 = this_00->_root;
    if (uVar9 <= uVar8) break;
    if (uVar8 != (long)pDVar5->_id) {
      pDVar5 = DTree::getNode(this_00,(int)uVar8);
      lVar6 = (long)pDVar5->_parent->_numOfChildren;
      uVar9 = lVar6 * 4 + 8;
      if (lVar6 < -2) {
        uVar9 = 0xffffffffffffffff;
      }
      piVar2 = (int *)operator_new__(uVar9);
      memset(piVar2,0,uVar9);
      this->aggPlaceholder[uVar8] = piVar2;
      uVar9 = _NUM_OF_ATTRIBUTES;
      uVar7 = _NUM_OF_ATTRIBUTES * 4 + 4;
      if (0x3fffffffffffffff < _NUM_OF_ATTRIBUTES + 1) {
        uVar7 = 0xffffffffffffffff;
      }
      piVar2 = (int *)operator_new__(uVar7);
      memset(piVar2,0,uVar7);
      this->lineagePlaceholder[uVar8] = piVar2;
    }
    uVar8 = uVar8 + 1;
  }
  registerAggregatesFromModel(this,pDVar5);
  uVar9 = _NUM_OF_ATTRIBUTES;
  piVar1 = this->_numberOfAggregatesPerNode;
  piVar2 = piVar1 + _NUM_OF_ATTRIBUTES;
  *piVar2 = 0;
  for (lVar6 = 0; uVar9 - 1 != lVar6; lVar6 = lVar6 + 1) {
    piVar2[lVar6 + 1] = piVar1[lVar6] + piVar2[lVar6];
  }
  piVar2 = piVar1 + uVar9 * 3;
  *piVar2 = 0;
  for (lVar6 = 0; uVar9 - 1 != lVar6; lVar6 = lVar6 + 1) {
    piVar2[lVar6 + 1] = piVar1[uVar9 * 2 + lVar6] + piVar2[lVar6];
  }
  return;
}

Assistant:

void CountAggregate::createAggregateRegister()
{
    _aggregateRegister.resize(NUM_OF_ATTRIBUTES);
    _lineageRegister.resize(NUM_OF_ATTRIBUTES);
    
    _numberOfAggregatesPerNode = new int[NUM_OF_ATTRIBUTES * 4]();
    _degreeOfLocalAggregates = new int[NUM_OF_ATTRIBUTES]();

    aggPlaceholder = new int*[NUM_OF_ATTRIBUTES];
    lineagePlaceholder = new int*[NUM_OF_ATTRIBUTES];

    onehotfeatures = new bool[NUM_OF_ATTRIBUTES]();
    isDetermined = new bool[NUM_OF_ATTRIBUTES]();
    determinedBy = new int[NUM_OF_ATTRIBUTES + 1]();

    /* Read in features from file and finds the labels. */
    _features = new int*[NUM_OF_FEATURES]();

    
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {        
        if (i != (size_t) _dTree->_root->_id)
        {
            int numOfChildren = _dTree->getNode(i)->_parent->_numOfChildren;
            aggPlaceholder[i] = new int[numOfChildren + 2]();
            lineagePlaceholder[i] = new int[NUM_OF_ATTRIBUTES + 1]();
        }
    }

    /* Registers aggregates to the d-tree nodes following the structure of the model. */
    registerAggregatesFromModel(_dTree->_root);

    /* Setting the upper half of _numberOfAggregatesPerNode, which provides offsets */
    _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES] = 0;
    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES - 1; ++attID)
        _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + attID + 1] =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + attID]
            + _numberOfAggregatesPerNode[attID];

    _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3] = 0;
    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES - 1; ++attID)
        _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID + 1] =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID]
            + _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID];
}